

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ConstraintBlockSymbol::addThisVar(ConstraintBlockSymbol *this,Type *type)

{
  VariableSymbol *symbol;
  VariableLifetime local_1c;
  
  local_1c = Automatic;
  symbol = BumpAllocator::
           emplace<slang::ast::VariableSymbol,char_const(&)[5],slang::SourceLocation_const&,slang::ast::VariableLifetime>
                     (&((this->super_Scope).compilation)->super_BumpAllocator,(char (*) [5])"this",
                      &(type->super_Symbol).location,&local_1c);
  (symbol->super_ValueSymbol).declaredType.type = type;
  *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 3;
  this->thisVar = symbol;
  Scope::addMember(&this->super_Scope,(Symbol *)symbol);
  return;
}

Assistant:

void ConstraintBlockSymbol::addThisVar(const Type& type) {
    auto tv = getCompilation().emplace<VariableSymbol>("this", type.location,
                                                       VariableLifetime::Automatic);
    tv->setType(type);
    tv->flags |= VariableFlags::Const | VariableFlags::CompilerGenerated;
    thisVar = tv;
    addMember(*thisVar);
}